

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O0

bool google::protobuf::internal::WireFormat::ParseAndMergeMessageSetItem
               (CodedInputStream *input,Message *message)

{
  bool bVar1;
  Reflection *input_00;
  Message *in_RCX;
  MSReflective ms;
  Message *message_local;
  CodedInputStream *input_local;
  
  input_00 = Message::GetReflection(message);
  ms.message = in_RCX;
  ms.message_reflection = (Reflection *)message;
  bVar1 = ParseMessageSetItemImpl<google::protobuf::internal::WireFormat::ParseAndMergeMessageSetItem(google::protobuf::io::CodedInputStream*,google::protobuf::Message*)::MSReflective>
                    ((internal *)input,(CodedInputStream *)input_00,ms);
  return bVar1;
}

Assistant:

bool WireFormat::ParseAndMergeMessageSetItem(io::CodedInputStream* input,
                                             Message* message) {
  struct MSReflective {
    bool ParseField(int type_id, io::CodedInputStream* input) {
      const FieldDescriptor* field =
          message_reflection->FindKnownExtensionByNumber(type_id);
      return ParseAndMergeMessageSetField(type_id, field, message, input);
    }

    bool SkipField(uint32_t tag, io::CodedInputStream* input) {
      return WireFormat::SkipField(input, tag, nullptr);
    }

    const Reflection* message_reflection;
    Message* message;
  };

  return ParseMessageSetItemImpl(
      input, MSReflective{message->GetReflection(), message});
}